

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_hsort_is_sorted(uchar *elements,size_t n,size_t len)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    uVar2 = uVar2 + 1;
    if (n <= uVar2) {
      return;
    }
    iVar1 = secp256k1_memcmp_var(elements,elements + len,len);
    elements = elements + len;
  } while (iVar1 < 1);
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
          ,0xdfd,
          "test condition failed: secp256k1_memcmp_var(&elements[(i-1) * len], &elements[i * len], len) <= 0"
         );
  abort();
}

Assistant:

static void test_hsort_is_sorted(unsigned char *elements, size_t n, size_t len) {
    size_t i;
    for (i = 1; i < n; i++) {
        CHECK(secp256k1_memcmp_var(&elements[(i-1) * len], &elements[i * len], len) <= 0);
    }
}